

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall spv::Builder::makeIntConstant(Builder *this,Id typeId,uint value,bool specConstant)

{
  Op OVar1;
  Id IVar2;
  Instruction *this_00;
  undefined7 in_register_00000009;
  pointer *__ptr;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  Instruction *c;
  
  OVar1 = OpSpecConstant;
  if (((int)CONCAT71(in_register_00000009,specConstant) != 0) ||
     (IVar2 = findScalarConstant(this,OpTypeInt,OpConstant,typeId,value), OVar1 = OpConstant,
     IVar2 == 0)) {
    this_00 = (Instruction *)dxil_spv::allocate_in_thread(0x38);
    IVar2 = this->uniqueId + 1;
    this->uniqueId = IVar2;
    this_00->_vptr_Instruction = (_func_int **)&PTR__Instruction_001e31e0;
    this_00->resultId = IVar2;
    this_00->typeId = typeId;
    this_00->opCode = OVar1;
    (this_00->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00->block = (Block *)0x0;
    c = this_00;
    Instruction::addImmediateOperand(this_00,value);
    local_38._M_head_impl = this_00;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&this->constantsTypesGlobals,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_38);
    if (local_38._M_head_impl != (Instruction *)0x0) {
      (*(local_38._M_head_impl)->_vptr_Instruction[1])();
    }
    std::vector<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>::push_back
              (this->groupedConstants + 0x15,&c);
    Module::mapInstruction(&this->module,c);
    IVar2 = c->resultId;
  }
  return IVar2;
}

Assistant:

Id Builder::makeIntConstant(Id typeId, unsigned value, bool specConstant)
{
    Op opcode = specConstant ? OpSpecConstant : OpConstant;

    // See if we already made it. Applies only to regular constants, because specialization constants
    // must remain distinct for the purpose of applying a SpecId decoration.
    if (! specConstant) {
        Id existing = findScalarConstant(OpTypeInt, opcode, typeId, value);
        if (existing)
            return existing;
    }

    Instruction* c = new Instruction(getUniqueId(), typeId, opcode);
    c->addImmediateOperand(value);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));
    groupedConstants[OpTypeInt].push_back(c);
    module.mapInstruction(c);

    return c->getResultId();
}